

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::enableVertexAttribArray(ReferenceContext *this,deUint32 index)

{
  VertexArray *pVVar1;
  
  if (index < (uint)(this->m_limits).maxVertexAttribs) {
    pVVar1 = &this->m_clientVertexArray;
    if (this->m_vertexArrayBinding != (VertexArray *)0x0) {
      pVVar1 = this->m_vertexArrayBinding;
    }
    (pVVar1->m_arrays).
    super__Vector_base<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
    ._M_impl.super__Vector_impl_data._M_start[index].enabled = true;
    return;
  }
  if (this->m_lastError != 0) {
    return;
  }
  this->m_lastError = 0x501;
  return;
}

Assistant:

void ReferenceContext::enableVertexAttribArray (deUint32 index)
{
	RC_IF_ERROR(index >= (deUint32)m_limits.maxVertexAttribs, GL_INVALID_VALUE, RC_RET_VOID);

	rc::VertexArray& vao = (m_vertexArrayBinding) ? (*m_vertexArrayBinding) : (m_clientVertexArray);
	vao.m_arrays[index].enabled = true;
}